

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O2

void __thiscall
Assimp::LWSImporter::BuildGraph
          (LWSImporter *this,aiNode *nd,NodeDesc *src,
          vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *attach,
          BatchLoader *batch,aiCamera ***camOut,aiLight ***lightOut,
          vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *animOut)

{
  char *__rhs;
  list<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_> *plVar1;
  undefined8 uVar2;
  double dVar3;
  double _last;
  anon_enum_32 aVar4;
  uint uVar5;
  aiLight **ppaVar6;
  aiCamera **ppaVar7;
  ulong uVar8;
  aiNodeAnim *paVar9;
  aiScene *paVar10;
  Logger *this_00;
  aiNode *paVar11;
  aiNode **ppaVar12;
  aiNode *paVar13;
  _List_node_base *p_Var14;
  float fVar15;
  aiNode *paVar16;
  float fVar17;
  allocator local_121;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *local_120;
  BatchLoader *local_118;
  aiCamera ***local_110;
  NodeDesc *local_108;
  aiNodeAnim *anim;
  AnimResolver resolver;
  
  local_120 = attach;
  local_118 = batch;
  local_110 = camOut;
  SetupNodeName(this,nd,src);
  aVar4 = src->type;
  paVar11 = nd;
  if (aVar4 == CAMERA) {
    paVar13 = (aiNode *)operator_new(0x438);
    aiCamera::aiCamera((aiCamera *)paVar13);
    ppaVar7 = *local_110;
    *local_110 = ppaVar7 + 1;
    *ppaVar7 = (aiCamera *)paVar13;
    if (paVar13 != nd) {
      uVar5 = (nd->mName).length;
      (paVar13->mName).length = uVar5;
      memcpy((paVar13->mName).data,(nd->mName).data,(ulong)uVar5);
      (paVar13->mName).data[uVar5] = '\0';
    }
    goto LAB_0040dec1;
  }
  if (aVar4 == LIGHT) {
    paVar13 = (aiNode *)operator_new(0x46c);
    aiLight::aiLight((aiLight *)paVar13);
    ppaVar6 = *lightOut;
    *lightOut = ppaVar6 + 1;
    *ppaVar6 = (aiLight *)paVar13;
    uVar2 = *(undefined8 *)&(src->lightColor).b;
    fVar15 = (float)((ulong)uVar2 >> 0x20);
    fVar17 = fVar15 * (src->lightColor).r;
    paVar16 = (aiNode *)CONCAT44(fVar15 * (float)uVar2,(src->lightColor).g * fVar15);
    ((aiColor3D *)&paVar13->field_0x444)->r = fVar17;
    paVar13->mParent = paVar16;
    ((aiColor3D *)&(paVar13->mTransformation).d2)->r = fVar17;
    *(aiNode **)&(paVar13->mTransformation).d3 = paVar16;
    if (paVar13 != nd) {
      uVar5 = (nd->mName).length;
      (paVar13->mName).length = uVar5;
      memcpy((paVar13->mName).data,(nd->mName).data,(ulong)uVar5);
      (paVar13->mName).data[uVar5] = '\0';
    }
    if (src->lightType == 1) {
      (paVar13->mTransformation).a1 = 1.4013e-45;
    }
    else if (src->lightType == 2) {
      (paVar13->mTransformation).a1 = 4.2039e-45;
      fVar15 = src->lightConeAngle * 0.017453292;
      *(float *)((long)&paVar13->mChildren + 4) = fVar15;
      paVar13->mNumMeshes = (uint)(src->lightEdgeAngle * 0.017453292 + fVar15);
    }
    else {
      (paVar13->mTransformation).a1 = 2.8026e-45;
    }
    if (src->lightFalloffType == 1) {
      (paVar13->mTransformation).c3 = 1.0;
    }
    else {
      (paVar13->mTransformation).d1 = 1.0;
    }
    goto LAB_0040dec1;
  }
  if (aVar4 != OBJECT) goto LAB_0040dec1;
  if ((src->path)._M_string_length == 0) {
LAB_0040dcef:
    paVar10 = (aiScene *)0x0;
  }
  else {
    paVar10 = BatchLoader::GetImport(local_118,src->id);
    if (paVar10 == (aiScene *)0x0) {
      this_00 = DefaultLogger::get();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resolver,
                     "LWS: Failed to read external file ",&src->path);
      Logger::error(this_00,(char *)resolver.envelopes);
      std::__cxx11::string::~string((string *)&resolver);
      goto LAB_0040dcef;
    }
    paVar11 = paVar10->mRootNode;
    if (paVar11->mNumChildren == 1) {
      if (src->isPivotSet == false) {
        (src->pivotPos).x = (paVar11->mTransformation).a4;
        (src->pivotPos).y = (paVar10->mRootNode->mTransformation).b4;
        (src->pivotPos).z = -(paVar10->mRootNode->mTransformation).c4;
        paVar11 = paVar10->mRootNode;
      }
      paVar13 = *paVar11->mChildren;
      *paVar11->mChildren = (aiNode *)0x0;
      paVar11 = paVar10->mRootNode;
      if (paVar11 != (aiNode *)0x0) {
        aiNode::~aiNode(paVar11);
      }
      operator_delete(paVar11);
      paVar10->mRootNode = paVar13;
      (paVar13->mTransformation).a4 = 0.0;
      (paVar10->mRootNode->mTransformation).b4 = 0.0;
      (paVar10->mRootNode->mTransformation).c4 = 0.0;
    }
  }
  std::__cxx11::string::string((string *)&anim,"Pivot:",&local_121);
  __rhs = (nd->mName).data;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resolver,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&anim,__rhs);
  dVar3 = resolver.sample_rate;
  if ((ulong)resolver.sample_rate < 0x400) {
    (nd->mName).length = SUB84(resolver.sample_rate,0);
    memcpy(__rhs,resolver.envelopes,(size_t)resolver.sample_rate);
    (nd->mName).data[(long)dVar3] = '\0';
  }
  std::__cxx11::string::~string((string *)&resolver);
  std::__cxx11::string::~string((string *)&anim);
  nd->mNumChildren = 1;
  ppaVar12 = (aiNode **)operator_new__(8);
  nd->mChildren = ppaVar12;
  paVar13 = (aiNode *)operator_new(0x478);
  paVar11 = paVar13;
  aiNode::aiNode(paVar13);
  *nd->mChildren = paVar13;
  (*nd->mChildren)->mParent = nd;
  ((*nd->mChildren)->mTransformation).a4 = -(src->pivotPos).x;
  ((*nd->mChildren)->mTransformation).b4 = -(src->pivotPos).y;
  ((*nd->mChildren)->mTransformation).c4 = -(src->pivotPos).z;
  SetupNodeName((LWSImporter *)paVar11,*nd->mChildren,src);
  paVar11 = *nd->mChildren;
  if (paVar10 != (aiScene *)0x0) {
    resolver.envelopes =
         (list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)paVar10;
    resolver.sample_rate = (double)paVar11;
    std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
    emplace_back<Assimp::AttachmentInfo>(local_120,(AttachmentInfo *)&resolver);
  }
LAB_0040dec1:
  local_108 = src;
  LWO::AnimResolver::AnimResolver(&resolver,&src->channels,this->fps);
  LWO::AnimResolver::ExtractBindPose(&resolver,&nd->mTransformation);
  anim = (aiNodeAnim *)0x0;
  dVar3 = this->first;
  _last = this->last;
  if ((dVar3 != _last) || (NAN(dVar3) || NAN(_last))) {
    LWO::AnimResolver::SetAnimationRange(&resolver,dVar3,_last);
    LWO::AnimResolver::ExtractAnimChannel(&resolver,&anim,3);
    paVar9 = anim;
    if (anim != (aiNodeAnim *)0x0) {
      if ((aiNode *)anim != nd) {
        uVar5 = (nd->mName).length;
        (anim->mNodeName).length = uVar5;
        memcpy((anim->mNodeName).data,(nd->mName).data,(ulong)uVar5);
        (paVar9->mNodeName).data[uVar5] = '\0';
      }
      std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back(animOut,&anim);
    }
  }
  plVar1 = &local_108->children;
  if ((local_108->children).
      super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>._M_impl.
      _M_node.super__List_node_base._M_next != (_List_node_base *)plVar1) {
    uVar8 = (local_108->children).
            super__List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>.
            _M_impl._M_node._M_size;
    ppaVar12 = (aiNode **)operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 << 3);
    paVar11->mChildren = ppaVar12;
    p_Var14 = (_List_node_base *)plVar1;
    while (p_Var14 = (((_List_base<Assimp::LWS::NodeDesc_*,_std::allocator<Assimp::LWS::NodeDesc_*>_>
                        *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var14 != (_List_node_base *)plVar1) {
      paVar13 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar13);
      uVar5 = paVar11->mNumChildren;
      paVar11->mNumChildren = uVar5 + 1;
      paVar11->mChildren[uVar5] = paVar13;
      paVar13->mParent = paVar11;
      BuildGraph(this,paVar13,(NodeDesc *)p_Var14[1]._M_next,local_120,local_118,local_110,lightOut,
                 animOut);
    }
  }
  return;
}

Assistant:

void LWSImporter::BuildGraph(aiNode* nd, LWS::NodeDesc& src, std::vector<AttachmentInfo>& attach,
    BatchLoader& batch,
    aiCamera**& camOut,
    aiLight**& lightOut,
    std::vector<aiNodeAnim*>& animOut)
{
    // Setup a very cryptic name for the node, we want the user to be happy
    SetupNodeName(nd,src);
    aiNode* ndAnim = nd;

    // If the node is an object
    if (src.type == LWS::NodeDesc::OBJECT) {

        // If the object is from an external file, get it
        aiScene* obj = NULL;
        if (src.path.length() ) {
            obj = batch.GetImport(src.id);
            if (!obj) {
                ASSIMP_LOG_ERROR("LWS: Failed to read external file " + src.path);
            }
            else {
                if (obj->mRootNode->mNumChildren == 1) {

                    //If the pivot is not set for this layer, get it from the external object
                    if (!src.isPivotSet) {
                        src.pivotPos.x = +obj->mRootNode->mTransformation.a4;
                        src.pivotPos.y = +obj->mRootNode->mTransformation.b4;
                        src.pivotPos.z = -obj->mRootNode->mTransformation.c4; //The sign is the RH to LH back conversion
                    }

                    //Remove first node from obj (the old pivot), reset transform of second node (the mesh node)
                    aiNode* newRootNode = obj->mRootNode->mChildren[0];
                    obj->mRootNode->mChildren[0] = NULL;
                    delete obj->mRootNode;

                    obj->mRootNode = newRootNode;
                    obj->mRootNode->mTransformation.a4 = 0.0;
                    obj->mRootNode->mTransformation.b4 = 0.0;
                    obj->mRootNode->mTransformation.c4 = 0.0;
                }
            }
        }

        //Setup the pivot node (also the animation node), the one we received
        nd->mName = std::string("Pivot:") + nd->mName.data;
        ndAnim = nd;

        //Add the attachment node to it
        nd->mNumChildren = 1;
        nd->mChildren = new aiNode*[1];
        nd->mChildren[0] = new aiNode();
        nd->mChildren[0]->mParent = nd;
        nd->mChildren[0]->mTransformation.a4 = -src.pivotPos.x;
        nd->mChildren[0]->mTransformation.b4 = -src.pivotPos.y;
        nd->mChildren[0]->mTransformation.c4 = -src.pivotPos.z;
        SetupNodeName(nd->mChildren[0], src);

        //Update the attachment node
        nd = nd->mChildren[0];

        //Push attachment, if the object came from an external file
        if (obj) {
            attach.push_back(AttachmentInfo(obj,nd));
        }
    }

    // If object is a light source - setup a corresponding ai structure
    else if (src.type == LWS::NodeDesc::LIGHT) {
        aiLight* lit = *lightOut++ = new aiLight();

        // compute final light color
        lit->mColorDiffuse = lit->mColorSpecular = src.lightColor*src.lightIntensity;

        // name to attach light to node -> unique due to LWs indexing system
        lit->mName = nd->mName;

        // determine light type and setup additional members
        if (src.lightType == 2) { /* spot light */

            lit->mType = aiLightSource_SPOT;
            lit->mAngleInnerCone = (float)AI_DEG_TO_RAD( src.lightConeAngle );
            lit->mAngleOuterCone = lit->mAngleInnerCone+(float)AI_DEG_TO_RAD( src.lightEdgeAngle );

        }
        else if (src.lightType == 1) { /* directional light source */
            lit->mType = aiLightSource_DIRECTIONAL;
        }
        else lit->mType = aiLightSource_POINT;

        // fixme: no proper handling of light falloffs yet
        if (src.lightFalloffType == 1)
            lit->mAttenuationConstant = 1.f;
        else if (src.lightFalloffType == 1)
            lit->mAttenuationLinear = 1.f;
        else
            lit->mAttenuationQuadratic = 1.f;
    }

    // If object is a camera - setup a corresponding ai structure
    else if (src.type == LWS::NodeDesc::CAMERA) {
        aiCamera* cam = *camOut++ = new aiCamera();

        // name to attach cam to node -> unique due to LWs indexing system
        cam->mName = nd->mName;
    }

    // Get the node transformation from the LWO key
    LWO::AnimResolver resolver(src.channels,fps);
    resolver.ExtractBindPose(ndAnim->mTransformation);

    // .. and construct animation channels
    aiNodeAnim* anim = NULL;

    if (first != last) {
        resolver.SetAnimationRange(first,last);
        resolver.ExtractAnimChannel(&anim,AI_LWO_ANIM_FLAG_SAMPLE_ANIMS|AI_LWO_ANIM_FLAG_START_AT_ZERO);
        if (anim) {
            anim->mNodeName = ndAnim->mName;
            animOut.push_back(anim);
        }
    }

    // Add children
    if (!src.children.empty()) {
        nd->mChildren = new aiNode*[src.children.size()];
        for (std::list<LWS::NodeDesc*>::iterator it = src.children.begin(); it != src.children.end(); ++it) {
            aiNode* ndd = nd->mChildren[nd->mNumChildren++] = new aiNode();
            ndd->mParent = nd;

            BuildGraph(ndd,**it,attach,batch,camOut,lightOut,animOut);
        }
    }
}